

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O0

void anon_unknown.dwarf_9195::fillChannel<float>(Rand48 *random,FlatImageChannel *c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ImageChannel *this;
  ImageLevel *this_00;
  Box2i *pBVar5;
  float *pfVar6;
  undefined8 in_RSI;
  double dVar7;
  int x;
  int y;
  int yStep;
  int xStep;
  Box2i *dataWindow;
  TypedFlatImageChannel<float> *tc;
  undefined4 in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  ImageChannel *rangeMin;
  
  this = (ImageChannel *)
         __dynamic_cast(in_RSI,&Imf_3_4::FlatImageChannel::typeinfo,
                        &Imf_3_4::TypedFlatImageChannel<float>::typeinfo,0);
  if (this == (ImageChannel *)0x0) {
    __cxa_bad_cast();
  }
  rangeMin = this;
  this_00 = Imf_3_4::ImageChannel::level(this);
  pBVar5 = Imf_3_4::ImageLevel::dataWindow(this_00);
  iVar1 = Imf_3_4::ImageChannel::xSampling(this);
  iVar2 = Imf_3_4::ImageChannel::ySampling(this);
  for (iVar4 = (pBVar5->min).y; iVar4 <= (pBVar5->max).y; iVar4 = iVar2 + iVar4) {
    for (iVar3 = (pBVar5->min).x; iVar3 <= (pBVar5->max).x; iVar3 = iVar1 + iVar3) {
      dVar7 = Imath_3_2::Rand48::nextf
                        ((Rand48 *)CONCAT44(iVar4,iVar3),(double)rangeMin,
                         (double)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      in_stack_ffffffffffffffc4 = (float)dVar7;
      pfVar6 = (float *)Imf_3_4::TypedFlatImageChannel<float>::at((int)this,iVar3);
      *pfVar6 = in_stack_ffffffffffffffc4;
    }
  }
  return;
}

Assistant:

void
fillChannel (Rand48& random, FlatImageChannel& c)
{
    //
    // Fill image channel tc with random numbers
    //

    TypedFlatImageChannel<T>& tc = dynamic_cast<TypedFlatImageChannel<T>&> (c);

    const Box2i& dataWindow = tc.level ().dataWindow ();
    int          xStep      = tc.xSampling ();
    int          yStep      = tc.ySampling ();

    for (int y = dataWindow.min.y; y <= dataWindow.max.y; y += yStep)
        for (int x = dataWindow.min.x; x <= dataWindow.max.x; x += xStep)
            tc.at (x, y) = T (random.nextf (0.0, 100.0));
}